

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O1

void delete_bb(gen_ctx_t gen_ctx,bb_t_conflict bb)

{
  in_edge_t peVar1;
  loop_node_t_conflict plVar2;
  gen_ctx *pgVar3;
  bb_t pbVar4;
  bb_t pbVar5;
  bb_t pbVar6;
  bitmap_t pVVar7;
  void *__ptr;
  void *__ptr_00;
  HTAB_MIR_item_t *pHVar8;
  long lVar9;
  MIR_item_t pMVar10;
  bb_t_conflict bb_00;
  edge_t_conflict peVar11;
  uint uVar12;
  DLIST_LINK_bb_t *pDVar13;
  DLIST_out_edge_t *pDVar14;
  DLIST_dead_var_t *pDVar15;
  char **ppcVar16;
  DLIST_LINK_in_edge_t *pDVar17;
  HTAB_MIR_item_t **ppHVar18;
  size_t *rpost;
  MIR_context_t pMVar19;
  MIR_context_t pMVar20;
  out_edge_t peVar21;
  loop_node_t_conflict __ptr_01;
  loop_node_t plVar22;
  loop_node_t plVar23;
  loop_node_t __ptr_02;
  gen_ctx_t pgVar24;
  gen_ctx_t __ptr_03;
  
  peVar11 = (bb->out_edges).head;
  pMVar19 = (MIR_context_t)bb;
  while (peVar11 != (edge_t_conflict)0x0) {
    peVar21 = (peVar11->out_link).next;
    delete_edge(peVar11);
    peVar11 = peVar21;
  }
  peVar11 = (bb->in_edges).head;
  while (peVar11 != (edge_t_conflict)0x0) {
    peVar1 = (peVar11->in_link).next;
    delete_edge(peVar11);
    peVar11 = peVar1;
  }
  plVar2 = bb->loop_node;
  __ptr_01 = (loop_node_t_conflict)0x0;
  if (plVar2 == (loop_node_t_conflict)0x0) {
LAB_0015fb3c:
    pbVar4 = (bb_t)gen_ctx->curr_cfg;
    pbVar5 = (bb->bb_link).prev;
    if (pbVar5 == (bb_t)0x0) {
      if ((bb_t_conflict)pbVar4->bfs == bb) {
        pbVar4->bfs = (size_t)(bb->bb_link).next;
        goto LAB_0015fb68;
      }
LAB_0015fc9d:
      delete_bb_cold_3();
    }
    else {
      (pbVar5->bb_link).next = (bb->bb_link).next;
LAB_0015fb68:
      pbVar6 = (bb->bb_link).next;
      if ((pbVar6 != (bb_t)0x0) || (pbVar6 = pbVar4, (pbVar4->bb_link).prev == bb)) {
        (pbVar6->bb_link).prev = pbVar5;
        (bb->bb_link).prev = (bb_t)0x0;
        (bb->bb_link).next = (bb_t)0x0;
        plVar23 = (loop_node_t)bb->in;
        if ((plVar23 == (loop_node_t)0x0) ||
           (__ptr_01 = plVar23->entry, __ptr_01 == (loop_node_t)0x0)) {
          plVar23 = __ptr_01;
          delete_bb_cold_10();
LAB_0015fc84:
          delete_bb_cold_9();
LAB_0015fc89:
          __ptr_02 = plVar23;
          delete_bb_cold_8();
LAB_0015fc8e:
          delete_bb_cold_7();
LAB_0015fc93:
          __ptr_01 = __ptr_02;
          delete_bb_cold_6();
        }
        else {
          free(__ptr_01);
          free(plVar23);
          plVar22 = (loop_node_t)bb->out;
          if ((plVar22 == (loop_node_t)0x0) ||
             (plVar23 = plVar22->entry, plVar23 == (loop_node_t)0x0)) goto LAB_0015fc84;
          free(plVar23);
          free(plVar22);
          __ptr_02 = (loop_node_t)bb->gen;
          plVar23 = plVar22;
          if ((__ptr_02 == (loop_node_t)0x0) ||
             (plVar23 = __ptr_02->entry, plVar23 == (loop_node_t)0x0)) goto LAB_0015fc89;
          free(plVar23);
          free(__ptr_02);
          plVar23 = (loop_node_t)bb->kill;
          if ((plVar23 == (loop_node_t)0x0) ||
             (__ptr_02 = plVar23->entry, __ptr_02 == (loop_node_t)0x0)) goto LAB_0015fc8e;
          free(__ptr_02);
          free(plVar23);
          __ptr_01 = (loop_node_t_conflict)bb->dom_in;
          __ptr_02 = plVar23;
          if ((__ptr_01 == (loop_node_t_conflict)0x0) ||
             (__ptr_02 = __ptr_01->entry, __ptr_02 == (loop_node_t)0x0)) goto LAB_0015fc93;
          free(__ptr_02);
          free(__ptr_01);
          pVVar7 = bb->dom_out;
          if ((pVVar7 != (bitmap_t)0x0) &&
             (__ptr_01 = (loop_node_t_conflict)pVVar7->varr, __ptr_01 != (loop_node_t_conflict)0x0))
          {
            free(__ptr_01);
            free(pVVar7);
            free(bb);
            return;
          }
        }
        delete_bb_cold_5();
        goto LAB_0015fc9d;
      }
    }
    delete_bb_cold_4();
LAB_0015fca7:
    delete_bb_cold_1();
  }
  else {
    plVar23 = plVar2->parent;
    if (plVar23->entry == plVar2) {
      plVar23->entry = (loop_node_t)0x0;
    }
    pgVar3 = (gen_ctx *)(plVar2->children_link).prev;
    if (pgVar3 == (gen_ctx *)0x0) {
      if ((plVar23->children).head == plVar2) {
        (plVar23->children).head = (plVar2->children_link).next;
        goto LAB_0015fae9;
      }
      goto LAB_0015fca7;
    }
    pgVar3->addr_regs = (bitmap_t)(plVar2->children_link).next;
LAB_0015fae9:
    plVar22 = (plVar2->children_link).next;
    if (plVar22 != (loop_node_t)0x0) {
      pMVar19 = (MIR_context_t)&plVar22->children_link;
LAB_0015fb09:
      pMVar19->gen_ctx = pgVar3;
      (plVar2->children_link).prev = (loop_node_t)0x0;
      (plVar2->children_link).next = (loop_node_t)0x0;
      plVar23 = (bb->loop_node->u).preheader;
      if (plVar23 != (loop_node_t)0x0) {
        (plVar23->u).preheader = (loop_node_t)0x0;
      }
      __ptr_01 = bb->loop_node;
      free(__ptr_01);
      goto LAB_0015fb3c;
    }
    pMVar19 = (MIR_context_t)0x0;
    if ((plVar23->children).tail == plVar2) {
      pMVar19 = (MIR_context_t)&(plVar23->children).tail;
      goto LAB_0015fb09;
    }
  }
  delete_bb_cold_2();
  __ptr = *(void **)__ptr_01;
  if (((__ptr == (void *)0x0) || (uVar12 = *(int *)&__ptr_01->parent - 0xa7, 0xd < uVar12)) ||
     ((0x2007U >> (uVar12 & 0x1f) & 1) == 0)) {
    return;
  }
  if ((2 < uVar12) || (__ptr_00 = *(void **)((long)__ptr + 8), __ptr_00 == (void *)0x0)) {
LAB_0015fcf8:
    free(__ptr);
    return;
  }
  pgVar24 = *(gen_ctx_t *)((long)__ptr_00 + 0x10);
  if (pgVar24 != (gen_ctx_t)0x0) {
    free(pgVar24);
    free(__ptr_00);
    goto LAB_0015fcf8;
  }
  delete_insn_data_cold_1();
  DLIST_bb_insn_t_remove
            ((DLIST_bb_insn_t *)&((DLIST_in_edge_t *)&pMVar19->temp_string)->head[1].in_link.next,
             (bb_insn_t_conflict)pMVar19);
  pMVar19->gen_ctx->ctx = (MIR_context_t)0x0;
  pMVar20 = pMVar19;
  clear_bb_insn_dead_vars(pgVar24,(bb_insn_t_conflict)pMVar19);
  pHVar8 = pMVar19->module_item_tab;
  if (pHVar8 == (HTAB_MIR_item_t *)0x0) {
LAB_0015fd5f:
    free(pMVar19);
    return;
  }
  pgVar24 = (gen_ctx_t)((DLIST_LINK_in_edge_t *)&pHVar8->arg)->prev;
  if (pgVar24 != (gen_ctx_t)0x0) {
    free(pgVar24);
    free(pHVar8);
    goto LAB_0015fd5f;
  }
  delete_bb_insn_cold_1();
  if ((pgVar24 != (gen_ctx_t)0x0) && (pMVar20 != (MIR_context_t)0x0)) {
    pbVar4 = ((DLIST_LINK_bb_t *)&pMVar20->insn_nops)->prev;
    if (pbVar4 == (bb_t)0x0) {
      if (pgVar24->ctx != pMVar20) goto LAB_0015fdcf;
      pgVar24->ctx = (MIR_context_t)pMVar20->unspec_protos;
    }
    else {
      (pbVar4->bb_link).next = (bb_t)pMVar20->unspec_protos;
    }
    if ((bb_t)pMVar20->unspec_protos == (bb_t)0x0) {
      if (*(MIR_context_t *)&pgVar24->optimize_level != pMVar20) goto LAB_0015fdd4;
      pDVar13 = (DLIST_LINK_bb_t *)&pgVar24->optimize_level;
    }
    else {
      pDVar13 = &((bb_t)pMVar20->unspec_protos)->bb_link;
    }
    pDVar13->prev = pbVar4;
    ((DLIST_LINK_bb_t *)&pMVar20->insn_nops)->prev = (bb_t)0x0;
    pMVar20->unspec_protos = (VARR_MIR_proto_t *)0x0;
    return;
  }
  DLIST_bb_insn_t_remove_cold_1();
LAB_0015fdcf:
  DLIST_bb_insn_t_remove_cold_2();
LAB_0015fdd4:
  DLIST_bb_insn_t_remove_cold_3();
  peVar21 = (out_edge_t)pMVar20->temp_data;
  if (peVar21 != (out_edge_t)0x0) {
    __ptr_03 = pgVar24;
    do {
      pbVar4 = peVar21->dst;
      pDVar17 = (DLIST_LINK_in_edge_t *)&pbVar4->rpost;
      if (pbVar4 == (bb_t)0x0) {
        pDVar17 = (DLIST_LINK_in_edge_t *)&pMVar20->temp_data;
      }
      pDVar17->prev = (peVar21->in_link).prev;
      peVar1 = (peVar21->in_link).prev;
      if (peVar1 == (in_edge_t)0x0) {
        pDVar14 = (DLIST_out_edge_t *)&pMVar20->used_label_p;
        if (((DLIST_out_edge_t *)&pMVar20->used_label_p)->head != peVar21) {
          clear_bb_insn_dead_vars_cold_1();
          pbVar4 = (bb_t)(__ptr_03->free_dead_vars).tail;
          if (pbVar4 == (bb_t)0x0) {
            if ((__ptr_03->free_dead_vars).head == (dead_var_t_conflict)0x0) {
              pDVar15 = &__ptr_03->free_dead_vars;
              goto LAB_0015fe77;
            }
          }
          else {
            if (pbVar4->rpost == 0) {
              pDVar15 = (DLIST_dead_var_t *)&pbVar4->rpost;
LAB_0015fe77:
              pDVar15->head = (dead_var_t_conflict)peVar21;
              (peVar21->in_link).prev = (in_edge_t)0x0;
              peVar21->dst = pbVar4;
              (__ptr_03->free_dead_vars).tail = (dead_var_t_conflict)peVar21;
              return;
            }
            free_dead_var_cold_1();
          }
          free_dead_var_cold_2();
          pMVar19 = __ptr_03->ctx;
          pHVar8 = *(HTAB_MIR_item_t **)&__ptr_03->debug_level;
          if (pHVar8 == (HTAB_MIR_item_t *)0x0) {
            if ((gen_ctx_t)pMVar19->used_label_p == __ptr_03) {
              pMVar19->used_label_p = (VARR_uint8_t *)__ptr_03->to_free;
              goto LAB_0015fec2;
            }
            delete_edge_cold_1();
LAB_0015ff44:
            delete_edge_cold_2();
LAB_0015ff49:
            delete_edge_cold_3();
LAB_0015ff4e:
            delete_edge_cold_4();
            pbVar4 = peVar21->src;
            peVar21->src = (bb_t)((long)&pbVar4->index + 1);
            *(bb_t *)&__ptr_03->optimize_level = pbVar4;
            for (pVVar7 = __ptr_03->addr_regs; pVVar7 != (bitmap_t)0x0;
                pVVar7 = (bitmap_t)pVVar7[1].varr) {
              bb_00 = (bb_t_conflict)pVVar7->size;
              if (bb_00->pre == 0) {
                DFS(bb_00,(size_t *)peVar21,rpost);
              }
              else if (bb_00->rpost == 0) {
                *(undefined1 *)((long)&pVVar7[2].els_num + 1) = 1;
              }
            }
            pMVar10 = (MIR_item_t)*rpost;
            *rpost = (size_t)((long)&pMVar10[-1].u + 7);
            __ptr_03->curr_func_item = pMVar10;
            return;
          }
          pHVar8->free_func = (_func_void_MIR_item_t_void_ptr *)__ptr_03->to_free;
LAB_0015fec2:
          if (__ptr_03->to_free == (VARR_void_ptr_t *)0x0) {
            if ((gen_ctx_t)pMVar19->module_item_tab != __ptr_03) goto LAB_0015ff44;
            ppHVar18 = &pMVar19->module_item_tab;
          }
          else {
            ppHVar18 = (HTAB_MIR_item_t **)&__ptr_03->to_free[1].size;
          }
          *ppHVar18 = pHVar8;
          *(undefined8 *)&__ptr_03->debug_level = 0;
          __ptr_03->to_free = (VARR_void_ptr_t *)0x0;
          lVar9 = *(long *)&__ptr_03->optimize_level;
          pMVar10 = __ptr_03->curr_func_item;
          if (pMVar10 == (MIR_item_t)0x0) {
            if (*(gen_ctx_t *)(lVar9 + 0x30) != __ptr_03) goto LAB_0015ff49;
            *(FILE **)(lVar9 + 0x30) = __ptr_03->debug_file;
          }
          else {
            (pMVar10->item_link).next = (MIR_item_t)__ptr_03->debug_file;
          }
          if (__ptr_03->debug_file == (FILE *)0x0) {
            if (*(gen_ctx_t *)(lVar9 + 0x38) != __ptr_03) goto LAB_0015ff4e;
            ppcVar16 = (char **)(lVar9 + 0x38);
          }
          else {
            ppcVar16 = &__ptr_03->debug_file->_IO_read_end;
          }
          *ppcVar16 = (char *)pMVar10;
          __ptr_03->curr_func_item = (MIR_item_t)0x0;
          __ptr_03->debug_file = (FILE *)0x0;
          free(__ptr_03);
          return;
        }
      }
      else {
        pDVar14 = (DLIST_out_edge_t *)&peVar1->dst;
      }
      pDVar14->head = (out_edge_t)pbVar4;
      peVar21->dst = (bb_t)0x0;
      (peVar21->in_link).prev = (in_edge_t)0x0;
      __ptr_03 = pgVar24;
      free_dead_var(pgVar24,(dead_var_t_conflict)peVar21);
      peVar21 = (out_edge_t)pMVar20->temp_data;
    } while (peVar21 != (out_edge_t)0x0);
  }
  return;
}

Assistant:

static void delete_bb (gen_ctx_t gen_ctx, bb_t bb) {
  edge_t e, next_e;

  for (e = DLIST_HEAD (out_edge_t, bb->out_edges); e != NULL; e = next_e) {
    next_e = DLIST_NEXT (out_edge_t, e);
    delete_edge (e);
  }
  for (e = DLIST_HEAD (in_edge_t, bb->in_edges); e != NULL; e = next_e) {
    next_e = DLIST_NEXT (in_edge_t, e);
    delete_edge (e);
  }
  if (bb->loop_node != NULL) {
    if (bb->loop_node->parent->entry == bb->loop_node) bb->loop_node->parent->entry = NULL;
    DLIST_REMOVE (loop_node_t, bb->loop_node->parent->children, bb->loop_node);
    if (bb->loop_node->u.preheader_loop != NULL)
      bb->loop_node->u.preheader_loop->u.preheader = NULL;
    free (bb->loop_node);
  }
  DLIST_REMOVE (bb_t, curr_cfg->bbs, bb);
  bitmap_destroy (bb->in);
  bitmap_destroy (bb->out);
  bitmap_destroy (bb->gen);
  bitmap_destroy (bb->kill);
  bitmap_destroy (bb->dom_in);
  bitmap_destroy (bb->dom_out);
  free (bb);
}